

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O0

QDebug QtPrivate::printSequentialContainer<QList<QDBusObjectPath>>
                 (QDebug *debug,char *which,QList<QDBusObjectPath> *c)

{
  bool bVar1;
  QDebug *o;
  QDebug *in_RDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  const_iterator end;
  const_iterator it;
  QDebugStateSaver saver;
  Stream *this;
  QDebug local_50;
  QDebug local_48;
  QDBusObjectPath *local_40;
  QDebug in_stack_ffffffffffffffc8;
  QDebug local_30;
  QDBusObjectPath *local_28;
  const_iterator local_20;
  const_iterator local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = 0xaaaaaaaaaaaaaaaa;
  this = in_RDI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_10,(QDebug *)in_RSI);
  QDebug::nospace(in_RSI);
  QDebug::operator<<(in_RDX,(char *)in_stack_ffffffffffffffc8.stream);
  QDebug::operator<<((QDebug *)this,(char)((ulong)in_RDI >> 0x38));
  local_18.i = (QDBusObjectPath *)0xaaaaaaaaaaaaaaaa;
  local_18 = QList<QDBusObjectPath>::begin((QList<QDBusObjectPath> *)this);
  local_20.i = (QDBusObjectPath *)0xaaaaaaaaaaaaaaaa;
  local_28 = (QDBusObjectPath *)QList<QDBusObjectPath>::end((QList<QDBusObjectPath> *)this);
  local_20 = (const_iterator)local_28;
  bVar1 = QList<QDBusObjectPath>::const_iterator::operator!=(&local_18,(const_iterator)local_28);
  if (bVar1) {
    QDebug::QDebug((QDebug *)&stack0xffffffffffffffc8,in_RSI);
    QList<QDBusObjectPath>::const_iterator::operator*(&local_18);
    operator<<((QDebug *)&local_30,(QDBusObjectPath *)&stack0xffffffffffffffc8);
    QDebug::~QDebug(&local_30);
    QDebug::~QDebug((QDebug *)&stack0xffffffffffffffc8);
    QList<QDBusObjectPath>::const_iterator::operator++(&local_18);
  }
  while( true ) {
    local_40 = local_20.i;
    bVar1 = QList<QDBusObjectPath>::const_iterator::operator!=(&local_18,local_20);
    if (!bVar1) break;
    o = QDebug::operator<<(in_RDX,(char *)in_stack_ffffffffffffffc8.stream);
    QDebug::QDebug(&local_50,o);
    QList<QDBusObjectPath>::const_iterator::operator*(&local_18);
    operator<<((QDebug *)&local_48,(QDBusObjectPath *)&local_50);
    QDebug::~QDebug(&local_48);
    QDebug::~QDebug(&local_50);
    QList<QDBusObjectPath>::const_iterator::operator++(&local_18);
  }
  QDebug::operator<<((QDebug *)this,(char)((ulong)in_RDI >> 0x38));
  QDebug::QDebug((QDebug *)this,(QDebug *)in_RDI);
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QDebug)this;
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}